

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_column_data.cpp
# Opt level: O2

void duckdb::PartitionedColumnData::BuildPartitionSel<true>
               (PartitionedColumnDataAppendState *state,idx_t append_count)

{
  fixed_size_map_t<duckdb::list_entry_t> *this;
  long *plVar1;
  VectorType VVar2;
  _Head_base<0UL,_duckdb::list_entry_t_*,_false> _Var3;
  uint64_t uVar4;
  idx_t iVar5;
  mapped_type *pmVar6;
  InternalException *this_00;
  idx_t i;
  long lVar7;
  idx_t iVar8;
  key_type *index;
  key_type *key;
  bool bVar9;
  allocator local_59;
  idx_t local_58;
  iterator partition_entry;
  
  this = &state->fixed_partition_entries;
  fixed_size_map_t<duckdb::list_entry_t>::clear(this);
  key = (key_type *)(state->partition_indices).data;
  VVar2 = (state->partition_indices).vector_type;
  local_58 = append_count;
  if (VVar2 == CONSTANT_VECTOR) {
    pmVar6 = fixed_size_map_t<duckdb::list_entry_t>::operator[](this,key);
    pmVar6->offset = 0;
    pmVar6->length = append_count;
  }
  else {
    if (VVar2 != FLAT_VECTOR) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&partition_entry,"Unexpected VectorType in PartitionedTupleData::Append",
                 &local_59);
      InternalException::InternalException(this_00,(string *)&partition_entry);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    index = key;
    while (bVar9 = append_count != 0, append_count = append_count - 1, bVar9) {
      fixed_size_map_t<duckdb::list_entry_t>::find(&partition_entry,this,index);
      if (((uint)this->capacity & 7) == partition_entry.idx_in_entry &&
          this->capacity >> 3 == partition_entry.entry_idx) {
        pmVar6 = fixed_size_map_t<duckdb::list_entry_t>::operator[](this,index);
        pmVar6->offset = 0;
        pmVar6->length = 1;
      }
      else {
        plVar1 = (long *)((long)(((partition_entry.map)->values).
                                 super_unique_ptr<duckdb::list_entry_t[],_std::default_delete<duckdb::list_entry_t[]>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::list_entry_t,_std::default_delete<duckdb::list_entry_t[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::list_entry_t_*,_std::default_delete<duckdb::list_entry_t[]>_>
                                 .super__Head_base<0UL,_duckdb::list_entry_t_*,_false>._M_head_impl
                                + partition_entry.entry_idx * 8 + partition_entry.idx_in_entry) + 8)
        ;
        *plVar1 = *plVar1 + 1;
      }
      index = index + 1;
    }
  }
  iVar5 = local_58;
  if ((state->fixed_partition_entries).count != 1) {
    fixed_size_map_t<duckdb::list_entry_t>::begin(&partition_entry,this);
    lVar7 = 0;
    while( true ) {
      if (((uint)this->capacity & 7) == partition_entry.idx_in_entry &&
          this->capacity >> 3 == partition_entry.entry_idx) break;
      _Var3._M_head_impl =
           ((partition_entry.map)->values).
           super_unique_ptr<duckdb::list_entry_t[],_std::default_delete<duckdb::list_entry_t[]>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::list_entry_t,_std::default_delete<duckdb::list_entry_t[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::list_entry_t_*,_std::default_delete<duckdb::list_entry_t[]>_>
           .super__Head_base<0UL,_duckdb::list_entry_t_*,_false>._M_head_impl;
      _Var3._M_head_impl[partition_entry.entry_idx * 8 + partition_entry.idx_in_entry].offset =
           lVar7;
      lVar7 = lVar7 + *(long *)((long)(_Var3._M_head_impl +
                                      partition_entry.entry_idx * 8 + partition_entry.idx_in_entry)
                               + 8);
      fixed_size_map_iterator<duckdb::list_entry_t,_false>::operator++(&partition_entry);
    }
    for (iVar8 = 0; iVar5 != iVar8; iVar8 = iVar8 + 1) {
      pmVar6 = fixed_size_map_t<duckdb::list_entry_t>::operator[](this,key);
      uVar4 = pmVar6->offset;
      pmVar6->offset = uVar4 + 1;
      (state->partition_sel).sel_vector[uVar4] = (sel_t)iVar8;
      key = key + 1;
    }
  }
  return;
}

Assistant:

void PartitionedColumnData::BuildPartitionSel(PartitionedColumnDataAppendState &state, const idx_t append_count) {
	using GETTER = TemplatedMapGetter<list_entry_t, fixed>;
	auto &partition_entries = state.GetMap<fixed>();
	partition_entries.clear();
	const auto partition_indices = FlatVector::GetData<idx_t>(state.partition_indices);
	switch (state.partition_indices.GetVectorType()) {
	case VectorType::FLAT_VECTOR:
		for (idx_t i = 0; i < append_count; i++) {
			const auto &partition_index = partition_indices[i];
			auto partition_entry = partition_entries.find(partition_index);
			if (partition_entry == partition_entries.end()) {
				partition_entries[partition_index] = list_entry_t(0, 1);
			} else {
				GETTER::GetValue(partition_entry).length++;
			}
		}
		break;
	case VectorType::CONSTANT_VECTOR:
		partition_entries[partition_indices[0]] = list_entry_t(0, append_count);
		break;
	default:
		throw InternalException("Unexpected VectorType in PartitionedTupleData::Append");
	}

	// Early out: check if everything belongs to a single partition
	if (partition_entries.size() == 1) {
		return;
	}

	// Compute offsets from the counts
	idx_t offset = 0;
	for (auto it = partition_entries.begin(); it != partition_entries.end(); ++it) {
		auto &partition_entry = GETTER::GetValue(it);
		partition_entry.offset = offset;
		offset += partition_entry.length;
	}

	// Now initialize a single selection vector that acts as a selection vector for every partition
	auto &partition_sel = state.partition_sel;
	for (idx_t i = 0; i < append_count; i++) {
		const auto &partition_index = partition_indices[i];
		auto &partition_offset = partition_entries[partition_index].offset;
		partition_sel[partition_offset++] = UnsafeNumericCast<sel_t>(i);
	}
}